

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
detail::writer::operator()(writer *this,optional_field<example::exercise_t,_0UL> *val)

{
  value_type *pvVar1;
  reference_const_type val_00;
  undefined8 uVar2;
  
  pvVar1 = this->optv_;
  if (pvVar1 == (value_type *)0x0) {
    uVar2 = __cxa_allocate_exception(0x40);
    bad_message();
    __cxa_throw(uVar2,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  if ((val->super_optional<example::exercise_t>).super_type.m_initialized == true) {
    (this->opts_).super__Base_bitset<1UL>._M_w = 0xffff;
    *pvVar1 = 0xffff;
    val_00 = boost::optional<example::exercise_t>::get(&val->super_optional<example::exercise_t>);
    operator()(this,val_00);
    return;
  }
  return;
}

Assistant:

void operator()(example::optional_field<T, N> const& val) const {
        if (!optv_)
            throw bad_message();
        if (val) {
            opts_.set();
            *optv_ = static_cast<example::opt_fields::value_type>(opts_.to_ulong());
            (*this)(*val);
        }
    }